

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O0

uint32_t get_C(istream *is)

{
  istream *piVar1;
  bool local_5d;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  char local_1d;
  uint32_t repeats;
  char ch;
  istream *piStack_18;
  uint32_t num;
  istream *is_local;
  
  repeats = 0;
  local_24 = 0;
  piStack_18 = is;
  do {
    while( true ) {
      local_5d = false;
      if (local_24 < 3) {
        piVar1 = std::operator>>(piStack_18,&local_1d);
        local_5d = std::ios::operator_cast_to_bool
                             ((ios *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18)));
      }
      if (local_5d == false) {
        return repeats;
      }
      if (local_1d != 'C') break;
      repeats = repeats + 100;
      local_24 = local_24 + 1;
    }
    if (local_1d != 'D') {
      if (local_1d != 'M') {
        std::istream::unget();
        return repeats;
      }
      if (local_24 == 1) {
        return repeats + 800;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Invalid roman numeral.",&local_49);
      error(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    if (local_24 != 0) {
      return repeats + 300;
    }
    repeats = repeats + 500;
  } while( true );
}

Assistant:

uint32_t get_C(std::istream& is)
{
	uint32_t num{ 0 };
	char ch;
	uint32_t repeats{ 0 };
	while (repeats < Roman_int::max_repeating_numerals && is >> ch)
	{
		switch (ch)
		{
		case 'M':
		{
			if (repeats == 1)
			{
				return num + 800;
			}
			else
			{
				error("Invalid roman numeral.");
			}
		}
		case 'D':
		{
			if (repeats > 0)
			{
				return num + 300;
			}
			else
			{
				num += 500;
			}
			break;
		}
		case 'C':
		{
			num += 100;
			++repeats;
			break;
		}
		default:
			is.unget();
			return num;
		}
	}
	return num;
}